

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cc
# Opt level: O0

PcodeOp * __thiscall FlowInfo::target(FlowInfo *this,Address *addr)

{
  bool bVar1;
  reference ppVar2;
  Address *this_00;
  PcodeOp *pPVar3;
  AddrSpace *this_01;
  string *psVar4;
  ostream *poVar5;
  LowlevelError *this_02;
  string local_200 [48];
  ostringstream local_1d0 [8];
  ostringstream errmsg;
  Address local_58;
  _Base_ptr local_48;
  undefined8 local_40;
  PcodeOp *retop;
  SeqNum *seq;
  _Base_ptr local_28;
  _Rb_tree_const_iterator<std::pair<const_Address,_FlowInfo::VisitStat>_> local_20;
  const_iterator iter;
  Address *addr_local;
  FlowInfo *this_local;
  
  iter._M_node = (_Base_ptr)addr;
  std::_Rb_tree_const_iterator<std::pair<const_Address,_FlowInfo::VisitStat>_>::
  _Rb_tree_const_iterator(&local_20);
  local_28 = (_Base_ptr)
             std::
             map<Address,_FlowInfo::VisitStat,_std::less<Address>,_std::allocator<std::pair<const_Address,_FlowInfo::VisitStat>_>_>
             ::find(&this->visited,iter._M_node);
  local_20._M_node = local_28;
  do {
    seq = (SeqNum *)
          std::
          map<Address,_FlowInfo::VisitStat,_std::less<Address>,_std::allocator<std::pair<const_Address,_FlowInfo::VisitStat>_>_>
          ::end(&this->visited);
    bVar1 = std::operator!=(&local_20,(_Self *)&seq);
    if (!bVar1) {
LAB_0059903c:
      std::__cxx11::ostringstream::ostringstream(local_1d0);
      std::operator<<((ostream *)local_1d0,"Could not find op at target address: (");
      this_01 = Address::getSpace((Address *)iter._M_node);
      psVar4 = AddrSpace::getName_abi_cxx11_(this_01);
      poVar5 = std::operator<<((ostream *)local_1d0,(string *)psVar4);
      std::operator<<(poVar5,',');
      Address::printRaw((Address *)iter._M_node,(ostream *)local_1d0);
      std::operator<<((ostream *)local_1d0,')');
      this_02 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::__cxx11::ostringstream::str();
      LowlevelError::LowlevelError(this_02,local_200);
      __cxa_throw(this_02,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_Address,_FlowInfo::VisitStat>_>::operator*
                       (&local_20);
    retop = (PcodeOp *)&ppVar2->second;
    this_00 = SeqNum::getAddr((SeqNum *)retop);
    bVar1 = Address::isInvalid(this_00);
    if (!bVar1) {
      pPVar3 = PcodeOpBank::findOp(this->obank,(SeqNum *)retop);
      if (pPVar3 != (PcodeOp *)0x0) {
        return pPVar3;
      }
      local_40 = 0;
      goto LAB_0059903c;
    }
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_Address,_FlowInfo::VisitStat>_>::operator*
                       (&local_20);
    std::_Rb_tree_const_iterator<std::pair<const_Address,_FlowInfo::VisitStat>_>::operator*
              (&local_20);
    Address::operator+(&local_58,(int4)ppVar2);
    local_48 = (_Base_ptr)
               std::
               map<Address,_FlowInfo::VisitStat,_std::less<Address>,_std::allocator<std::pair<const_Address,_FlowInfo::VisitStat>_>_>
               ::find(&this->visited,&local_58);
    local_20._M_node = local_48;
  } while( true );
}

Assistant:

PcodeOp *FlowInfo::target(const Address &addr) const

{
  map<Address,VisitStat>::const_iterator iter;

  iter = visited.find(addr);
  while(iter != visited.end()) {
    const SeqNum &seq( (*iter).second.seqnum );
    if (!seq.getAddr().isInvalid()) {
      PcodeOp *retop = obank.findOp(seq);
      if (retop != (PcodeOp *)0)
	return retop;
      break;
    }
    // Visit fall thru address in case of no-op
    iter = visited.find( (*iter).first + (*iter).second.size );
  }
  ostringstream errmsg;
  errmsg << "Could not find op at target address: (";
  errmsg << addr.getSpace()->getName() << ',';
  addr.printRaw(errmsg);
  errmsg << ')';
  throw LowlevelError(errmsg.str());
}